

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenRefEq(BinaryenModuleRef module,BinaryenExpressionRef left,BinaryenExpressionRef right)

{
  RefEq *this;
  
  this = (RefEq *)MixedArena::allocSpace(&module->allocator,0x20,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression._id = RefEqId;
  (this->super_SpecificExpression<(wasm::Expression::Id)44>).super_Expression.type.id = 0;
  this->left = left;
  this->right = right;
  wasm::RefEq::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenRefEq(BinaryenModuleRef module,
                                    BinaryenExpressionRef left,
                                    BinaryenExpressionRef right) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefEq((Expression*)left, (Expression*)right));
}